

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

void __thiscall
cs::struct_builder::struct_builder
          (struct_builder *this,context_t *c,string *name,tree_type<cs::token_base_*> *parent,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *method)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  size_t sVar7;
  
  (this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var5 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var5;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  sVar7 = mCount + 1;
  mCount = sVar7;
  (this->mTypeId).type_idx._M_target = (type_info *)&structure::typeinfo;
  (this->mTypeId).type_hash = sVar7;
  paVar1 = &(this->mName).field_2;
  (this->mName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mName).field_2 + 8) = uVar6;
  }
  else {
    (this->mName)._M_dataplus._M_p = pcVar3;
    (this->mName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->mName)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  (this->mParent).mRoot = (tree_node *)0x0;
  (this->mParent).mRoot = parent->mRoot;
  parent->mRoot = (tree_node *)0x0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
            (&(this->mMethod).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>,
             &method->super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>
            );
  return;
}

Assistant:

struct_builder(context_t c, std::string name, tree_type<token_base *> parent,
		               std::deque<statement_base *> method) : mContext(std::move(c)),
			mTypeId(typeid(structure), ++mCount),
			mName(std::move(name)),
			mParent(std::move(parent)),
			mMethod(std::move(method)) {}